

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * __thiscall
Lowerer::LowerStrictBrOrCm
          (Lowerer *this,Instr *instr,JnHelperMethod helperMethod,bool noMathFastPath,bool isBranch,
          bool isHelper)

{
  LowererMD *pLVar1;
  Instr *pIVar2;
  Opnd *pOVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  OpndKind OVar7;
  uint32 uVar8;
  undefined4 *puVar9;
  LabelInstr *pLVar10;
  LabelInstr *instr_00;
  BranchInstr *pBVar11;
  RegOpnd *pRVar12;
  IndirOpnd *pIVar13;
  RegOpnd *pRVar14;
  IntConstOpnd *pIVar15;
  Opnd *pOVar16;
  Lowerer *this_00;
  LabelInstr *pLVar17;
  Lowerer *pLVar18;
  undefined7 in_register_00000081;
  undefined7 in_register_00000089;
  LibraryValue LVar19;
  LowererMD *baseOpnd;
  anon_union_2_4_ea848c7b_for_ValueType_13 local_6a;
  RegOpnd *local_68;
  JnHelperMethod local_60;
  LibraryValue local_5c;
  LowererMD *local_58;
  LabelInstr *local_50;
  undefined4 local_48;
  LibraryValue local_44;
  LabelInstr *local_40;
  Lowerer *local_38;
  
  local_48 = (undefined4)CONCAT71(in_register_00000081,isBranch);
  pIVar2 = instr->m_prev;
  local_60 = helperMethod;
  bVar5 = IR::Instr::IsNeq(instr);
  local_58 = (LowererMD *)instr->m_src1;
  local_68 = (RegOpnd *)instr->m_src2;
  local_38 = this;
  pLVar10 = (LabelInstr *)CONCAT71(in_register_00000089,isHelper);
  if (local_58 == (LowererMD *)0x0 || local_68 == (RegOpnd *)0x0) {
    local_40 = (LabelInstr *)
               CONCAT44(local_40._4_4_,(int)(LabelInstr *)CONCAT71(in_register_00000089,isHelper));
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x2947,"(src1 != nullptr && src2 != nullptr)","Expected 2 src opnds on BrC")
    ;
    if (!bVar6) goto LAB_005ddf8a;
    *puVar9 = 0;
    pLVar10 = local_40;
  }
  this_00 = local_38;
  bVar6 = SUB81(pLVar10,0);
  pLVar10 = IR::LabelInstr::New(Label,local_38->m_func,true);
  if (!noMathFastPath) {
    local_40 = pLVar10;
    pLVar10 = IR::Instr::GetOrCreateContinueLabel(instr,bVar6);
    if ((char)local_48 == '\0') {
      local_50 = IR::LabelInstr::New(Label,this_00->m_func,bVar6);
      instr_00 = IR::LabelInstr::New(Label,this_00->m_func,bVar6);
      local_44 = ValueFalse - bVar5;
      LVar19 = bVar5 + ValueTrue;
    }
    else {
      local_50 = pLVar10;
      if (!bVar5) {
        if (instr->m_kind != InstrKindBranch) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
          if (!bVar6) goto LAB_005ddf8a;
          *puVar9 = 0;
        }
        local_50 = (LabelInstr *)instr[1].m_next;
      }
      instr_00 = pLVar10;
      if (bVar5) {
        if (instr->m_kind != InstrKindBranch) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                             ,0x5e,"(this->IsBranchInstr())","Bad call to AsBranchInstr()");
          if (!bVar5) goto LAB_005ddf8a;
          *puVar9 = 0;
          this_00 = local_38;
        }
        instr_00 = (LabelInstr *)instr[1].m_next;
      }
      local_44 = ValueInvalid;
      LVar19 = ValueInvalid;
    }
    pLVar1 = local_58;
    bVar5 = IR::Opnd::IsEqual((Opnd *)local_58,&local_68->super_Opnd);
    if (bVar5) {
      local_6a = (instr->m_src1->m_valueType).field_0;
      bVar5 = ValueType::IsNotFloat((ValueType *)&local_6a.field_0);
      pLVar1 = local_58;
      if (bVar5) {
        if ((char)local_48 == '\0') {
          pOVar3 = instr->m_dst;
          pOVar16 = LoadLibraryValueOpnd(this_00,instr,LVar19);
          InsertMove(pOVar3,pOVar16,instr,true);
          InsertBranch(Br,false,pLVar10,instr);
        }
        else {
          pBVar11 = IR::BranchInstr::New(JMP,local_50,this_00->m_func);
          IR::Instr::InsertBefore(instr,&pBVar11->super_Instr);
        }
        IR::Instr::Remove(instr);
        return pIVar2;
      }
      local_5c = LVar19;
      OVar7 = IR::Opnd::GetKind((Opnd *)local_58);
      LVar19 = local_44;
      if (OVar7 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar5) {
LAB_005ddf8a:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar9 = 0;
        this_00 = local_38;
      }
      LowererMD::GenerateObjectTest(&this_00->m_lowererMD,(Opnd *)pLVar1,instr,local_40,false);
      pLVar17 = local_50;
    }
    else {
      OVar7 = IR::Opnd::GetKind((Opnd *)pLVar1);
      if (OVar7 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar5) goto LAB_005ddf8a;
        *puVar9 = 0;
        this_00 = local_38;
      }
      baseOpnd = local_58;
      pLVar1 = &this_00->m_lowererMD;
      pLVar18 = (Lowerer *)pLVar1;
      local_5c = LVar19;
      LowererMD::GenerateObjectTest(pLVar1,(Opnd *)local_58,instr,local_40,false);
      InsertCompareBranch(pLVar18,(Opnd *)baseOpnd,&local_68->super_Opnd,BrEq_A,false,local_50,instr
                          ,false);
      pRVar12 = IR::RegOpnd::New(TyInt64,this_00->m_func);
      OVar7 = IR::Opnd::GetKind((Opnd *)baseOpnd);
      if (OVar7 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar5) goto LAB_005ddf8a;
        *puVar9 = 0;
        baseOpnd = local_58;
      }
      this_00 = local_38;
      local_58 = pLVar1;
      pIVar13 = IR::IndirOpnd::New((RegOpnd *)baseOpnd,8,TyInt64,local_38->m_func,false);
      InsertMove(&pRVar12->super_Opnd,&pIVar13->super_Opnd,instr,true);
      pRVar14 = IR::RegOpnd::New(TyInt32,this_00->m_func);
      uVar8 = Js::Type::GetOffsetOfTypeId();
      pIVar13 = IR::IndirOpnd::New(pRVar12,uVar8,TyInt32,this_00->m_func,false);
      InsertMove(&pRVar14->super_Opnd,&pIVar13->super_Opnd,instr,true);
      pLVar18 = (Lowerer *)0x17;
      pIVar15 = IR::IntConstOpnd::New(0x17,TyInt32,this_00->m_func,true);
      pLVar17 = local_40;
      InsertCompareBranch(pLVar18,&pRVar14->super_Opnd,&pIVar15->super_Opnd,BrLe_A,false,local_40,
                          instr,false);
      pLVar18 = (Lowerer *)0x50;
      pIVar15 = IR::IntConstOpnd::New(0x50,TyInt32,this_00->m_func,true);
      InsertCompareBranch(pLVar18,&pRVar14->super_Opnd,&pIVar15->super_Opnd,BrEq_A,false,pLVar17,
                          instr,false);
      uVar8 = Js::Type::GetOffsetOfFlags();
      pIVar13 = IR::IndirOpnd::New(pRVar12,uVar8,TyInt8,this_00->m_func,false);
      pIVar15 = IR::IntConstOpnd::New(8,TyInt8,this_00->m_func,false);
      InsertTest(&pIVar13->super_Opnd,&pIVar15->super_Opnd,instr);
      InsertBranch(BrNeq_A,false,pLVar17,instr);
      pRVar12 = local_68;
      OVar7 = IR::Opnd::GetKind(&local_68->super_Opnd);
      LVar19 = local_44;
      pLVar17 = instr_00;
      if (OVar7 == OpndKindReg) {
        OVar7 = IR::Opnd::GetKind(&pRVar12->super_Opnd);
        if (OVar7 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar5) goto LAB_005ddf8a;
          *puVar9 = 0;
          this_00 = local_38;
        }
        LowererMD::GenerateObjectTest(local_58,&pRVar12->super_Opnd,instr,local_40,false);
        pRVar14 = IR::RegOpnd::New(TyInt64,this_00->m_func);
        OVar7 = IR::Opnd::GetKind(&pRVar12->super_Opnd);
        if (OVar7 != OpndKindReg) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar9 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
          if (!bVar5) goto LAB_005ddf8a;
          *puVar9 = 0;
        }
        this_00 = local_38;
        pIVar13 = IR::IndirOpnd::New(local_68,8,TyInt64,local_38->m_func,false);
        InsertMove(&pRVar14->super_Opnd,&pIVar13->super_Opnd,instr,true);
        uVar8 = Js::Type::GetOffsetOfFlags();
        pIVar13 = IR::IndirOpnd::New(pRVar14,uVar8,TyInt8,this_00->m_func,false);
        pIVar15 = IR::IntConstOpnd::New(8,TyInt8,this_00->m_func,false);
        InsertTest(&pIVar13->super_Opnd,&pIVar15->super_Opnd,instr);
        InsertBranch(BrNeq_A,false,local_40,instr);
      }
    }
    pBVar11 = IR::BranchInstr::New(JMP,pLVar17,this_00->m_func);
    IR::Instr::InsertBefore(instr,&pBVar11->super_Instr);
    if ((char)local_48 != '\0') {
      IR::Instr::InsertBefore(instr,&local_40->super_Instr);
      goto LAB_005ddf0c;
    }
    IR::Instr::InsertBefore(instr,&local_50->super_Instr);
    pOVar3 = instr->m_dst;
    pOVar16 = LoadLibraryValueOpnd(local_38,instr,local_5c);
    InsertMove(pOVar3,pOVar16,instr,true);
    InsertBranch(Br,false,pLVar10,instr);
    IR::Instr::InsertBefore(instr,&instr_00->super_Instr);
    pOVar3 = instr->m_dst;
    pOVar16 = LoadLibraryValueOpnd(local_38,instr,LVar19);
    this_00 = local_38;
    InsertMove(pOVar3,pOVar16,instr,true);
    InsertBranch(Br,false,pLVar10,instr);
    pLVar10 = local_40;
  }
  IR::Instr::InsertBefore(instr,&pLVar10->super_Instr);
  if ((char)local_48 == '\0') {
    LowerBinaryHelperMem(this_00,instr,local_60);
    return pIVar2;
  }
LAB_005ddf0c:
  LowerBrCMem(this_00,instr,local_60,true,true);
  return pIVar2;
}

Assistant:

IR::Instr *
Lowerer::LowerStrictBrOrCm(IR::Instr * instr, IR::JnHelperMethod helperMethod, bool noMathFastPath, bool isBranch, bool isHelper)
{
    IR::Instr * instrPrev = instr->m_prev;

    IR::LabelInstr * labelHelper = nullptr;
    IR::LabelInstr * labelFallThrough = nullptr;
    IR::LabelInstr * labelBranchSuccess = nullptr;
    IR::LabelInstr * labelBranchFailure = nullptr;
    LibraryValue successValueType = ValueInvalid;
    LibraryValue failureValueType = ValueInvalid;

    bool isEqual = !instr->IsNeq();
    IR::Opnd * src1 = instr->GetSrc1();
    IR::Opnd * src2 = instr->GetSrc2();

    AssertMsg(src1 != nullptr && src2 != nullptr, "Expected 2 src opnds on BrC");

    labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

    if (!noMathFastPath)
    {
        labelFallThrough = instr->GetOrCreateContinueLabel(isHelper);

        if (!isBranch)
        {
            labelBranchSuccess = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isHelper);
            labelBranchFailure = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, isHelper);
            successValueType = isEqual ? LibraryValue::ValueTrue : LibraryValue::ValueFalse;
            failureValueType = isEqual ? LibraryValue::ValueFalse : LibraryValue::ValueTrue;
        }
        else
        {
            labelBranchSuccess = isEqual ? instr->AsBranchInstr()->GetTarget() : labelFallThrough;
            labelBranchFailure = isEqual ? labelFallThrough : instr->AsBranchInstr()->GetTarget();
        }

        if (src1->IsEqual(src2))
        {
            if (instr->GetSrc1()->GetValueType().IsNotFloat())
            {
                if (!isBranch)
                {
                    InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, successValueType), instr);
                    InsertBranch(Js::OpCode::Br, labelFallThrough, instr);
                }
                else
                {
                    IR::BranchInstr * branch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelBranchSuccess, this->m_func);
                    instr->InsertBefore(branch);
                }
                instr->Remove();
                return instrPrev;
            }
#if !FLOATVAR
            m_lowererMD.GenerateObjectTest(src1->AsRegOpnd(), instr, labelHelper);
            IR::RegOpnd *src1TypeReg = IR::RegOpnd::New(TyMachReg, this->m_func);
            Lowerer::InsertMove(src1TypeReg, IR::IndirOpnd::New(src1->AsRegOpnd(), Js::RecyclableObject::GetOffsetOfType(), TyMachReg, this->m_func), instr);

            // MOV src1TypeIdReg, [src1TypeReg + offset(typeId)]
            IR::RegOpnd *src1TypeIdReg = IR::RegOpnd::New(TyInt32, this->m_func);
            Lowerer::InsertMove(src1TypeIdReg, IR::IndirOpnd::New(src1TypeReg, Js::Type::GetOffsetOfTypeId(), TyInt32, this->m_func), instr);

            // CMP src1TypeIdReg, TypeIds_Number
            // JEQ $helper
            IR::IntConstOpnd *numberTypeId = IR::IntConstOpnd::New(Js::TypeIds_Number, TyInt32, this->m_func, true);
            InsertCompareBranch(src1TypeIdReg, numberTypeId, Js::OpCode::BrEq_A, labelHelper, instr);
#else
            m_lowererMD.GenerateObjectTest(src1->AsRegOpnd(), instr, labelHelper);
#endif
            IR::BranchInstr * branch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelBranchSuccess, this->m_func);
            instr->InsertBefore(branch);
        }
        else
        {
            m_lowererMD.GenerateObjectTest(src1->AsRegOpnd(), instr, labelHelper);

#if !FLOATVAR
            IR::RegOpnd *src1TypeReg = IR::RegOpnd::New(TyMachReg, this->m_func);
            Lowerer::InsertMove(src1TypeReg, IR::IndirOpnd::New(src1->AsRegOpnd(), Js::RecyclableObject::GetOffsetOfType(), TyMachReg, this->m_func), instr);

            // MOV src1TypeIdReg, [src1TypeReg + offset(typeId)]
            IR::RegOpnd *src1TypeIdReg = IR::RegOpnd::New(TyInt32, this->m_func);
            Lowerer::InsertMove(src1TypeIdReg, IR::IndirOpnd::New(src1TypeReg, Js::Type::GetOffsetOfTypeId(), TyInt32, this->m_func), instr);

            // CMP src1TypeIdReg, TypeIds_Number
            // JEQ $helper
            IR::IntConstOpnd *numberTypeId = IR::IntConstOpnd::New(Js::TypeIds_Number, TyInt32, this->m_func, true);
            InsertCompareBranch(src1TypeIdReg, numberTypeId, Js::OpCode::BrEq_A, labelHelper, instr);
#endif
            //      CMP src1, src2                       - Ptr comparison
            //      JEQ $branchSuccess
            InsertCompareBranch(src1, src2, Js::OpCode::BrEq_A, labelBranchSuccess, instr);

#if FLOATVAR
            IR::RegOpnd *src1TypeReg = IR::RegOpnd::New(TyMachReg, this->m_func);
            Lowerer::InsertMove(src1TypeReg, IR::IndirOpnd::New(src1->AsRegOpnd(), Js::RecyclableObject::GetOffsetOfType(), TyMachReg, this->m_func), instr);

            // MOV src1TypeIdReg, [src1TypeReg + offset(typeId)]
            IR::RegOpnd *src1TypeIdReg = IR::RegOpnd::New(TyInt32, this->m_func);
            Lowerer::InsertMove(src1TypeIdReg, IR::IndirOpnd::New(src1TypeReg, Js::Type::GetOffsetOfTypeId(), TyInt32, this->m_func), instr);
#endif
            // CMP src1TypeIdReg, TypeIds_HostDispatch
            // JLE $helper (le condition covers string, int64, uint64, hostdispatch, as well as undefined, null, boolean)
            IR::IntConstOpnd *hostDispatchTypeId = IR::IntConstOpnd::New(Js::TypeIds_HostDispatch, TyInt32, this->m_func, true);
            InsertCompareBranch(src1TypeIdReg, hostDispatchTypeId, Js::OpCode::BrLe_A, labelHelper, instr);

            // CMP src1TypeIdReg, TypeIds_GlobalObject
            // JE $helper
            IR::IntConstOpnd *globalObjectTypeId = IR::IntConstOpnd::New(Js::TypeIds_GlobalObject, TyInt32, this->m_func, true);
            InsertCompareBranch(src1TypeIdReg, globalObjectTypeId, Js::OpCode::BrEq_A, labelHelper, instr);

            // TEST src1TypeReg->flags, TypeFlagMask_EngineExternal
            // JE $helper

            IR::Opnd *flags = IR::IndirOpnd::New(src1TypeReg, Js::Type::GetOffsetOfFlags(), TyInt8, this->m_func);
            InsertTestBranch(flags, IR::IntConstOpnd::New(TypeFlagMask_EngineExternal, TyInt8, this->m_func), Js::OpCode::BrNeq_A, labelHelper, instr);

            if (src2->IsRegOpnd())
            {
                m_lowererMD.GenerateObjectTest(src2->AsRegOpnd(), instr, labelHelper);
                // MOV src2TypeReg, [src2 + offset(type)]
                // TEST [src2TypeReg + offset(flags)], TypeFlagMask_EngineExternal
                // JE $helper
                IR::RegOpnd *src2TypeReg = IR::RegOpnd::New(TyMachReg, this->m_func);
                IR::IndirOpnd *src2Type = IR::IndirOpnd::New(src2->AsRegOpnd(), Js::RecyclableObject::GetOffsetOfType(), TyMachReg, this->m_func);
                Lowerer::InsertMove(src2TypeReg, src2Type, instr);
                IR::Opnd *src2Flags = IR::IndirOpnd::New(src2TypeReg, Js::Type::GetOffsetOfFlags(), TyInt8, this->m_func);
                InsertTestBranch(src2Flags, IR::IntConstOpnd::New(TypeFlagMask_EngineExternal, TyInt8, this->m_func), Js::OpCode::BrNeq_A, labelHelper, instr);
            }

            // JMP $done
            IR::BranchInstr * branch = IR::BranchInstr::New(LowererMD::MDUncondBranchOpcode, labelBranchFailure, this->m_func);
            instr->InsertBefore(branch);
        }

        if (!isBranch)
        {
            instr->InsertBefore(labelBranchSuccess);
            InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, successValueType), instr);
            InsertBranch(Js::OpCode::Br, labelFallThrough, instr);

            instr->InsertBefore(labelBranchFailure);
            InsertMove(instr->GetDst(), LoadLibraryValueOpnd(instr, failureValueType), instr);
            InsertBranch(Js::OpCode::Br, labelFallThrough, instr);
        }
    }

    instr->InsertBefore(labelHelper);

    if (isBranch)
    {
        LowerBrCMem(instr, helperMethod, true, true);
    }
    else
    {
        LowerBinaryHelperMem(instr, helperMethod);
    }

    return instrPrev;
}